

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 2mid.cpp
# Opt level: O1

string * instrument_callback_abi_cxx11_
                   (string *__return_storage_ptr__,uint8_t bank_msb,uint8_t bank_lsb,
                   uint8_t instrument)

{
  mapped_type *this;
  ostream *poVar1;
  uint uVar2;
  string name;
  string si;
  string smsb;
  string slsb;
  char *local_b0;
  long local_a8;
  char local_a0;
  undefined7 uStack_9f;
  key_type local_90;
  key_type local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50 = &local_40;
  local_48 = 0;
  local_40 = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  uVar2 = 1;
  if (9 < bank_msb) {
    uVar2 = 3 - (bank_msb < 100);
  }
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar2);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_b0,uVar2,(uint)bank_msb);
  std::__cxx11::string::operator=((string *)&local_70,(string *)&local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  uVar2 = 1;
  if (9 < bank_lsb) {
    uVar2 = 3 - (bank_lsb < 100);
  }
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar2);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_b0,uVar2,(uint)bank_lsb);
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  uVar2 = 1;
  if (9 < instrument) {
    uVar2 = 3 - (instrument < 100);
  }
  local_b0 = &local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,(char)uVar2);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_b0,uVar2,(uint)instrument);
  std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  local_a8 = 0;
  local_a0 = '\0';
  local_b0 = &local_a0;
  this = std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
         ::operator[](&js_abi_cxx11_,&local_70);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator[](this,&local_90);
  std::__cxx11::string::_M_assign((string *)&local_b0);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_70._M_dataplus._M_p,local_70._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_b0,local_a8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_70._M_dataplus._M_p);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_90._M_dataplus._M_p);
  if (local_a8 != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b0);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string instrument_callback(uint8_t bank_msb, uint8_t bank_lsb, uint8_t instrument)
{

	std::string smsb, slsb, si;

	smsb = std::to_string((int)bank_msb);
	slsb = std::to_string((int)bank_lsb);
	si = std::to_string((int)instrument);

	std::string name;

	try
	{
		name = js[smsb][si];
		std::cout << smsb << ":" << si << " " << name << std::endl;
	}
	catch (...)
	{
		name = "";
	}

	std::string out;

	out += smsb;
	out += ":";
	out += si;
	
	if (name.length())
	{
		out += " ";
		out += name;
	}

	return out;
}